

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O2

CAmount wallet::GetCachableAmount
                  (CWallet *wallet,CWalletTx *wtx,AmountType type,isminefilter *filter)

{
  uint filter_00;
  long lVar1;
  CTransaction *tx;
  CAmount value;
  ulong uVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  filter_00 = *filter;
  uVar2 = (ulong)filter_00;
  if ((wtx->m_amounts[type].m_cached.super__Base_bitset<1UL>._M_w >> (uVar2 & 0x3f) & 1) == 0) {
    tx = (wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (type == DEBIT) {
      value = CWallet::GetDebit(wallet,tx,filter);
    }
    else {
      value = TxGetCredit(wallet,tx,filter);
    }
    CachableAmount::Set(wtx->m_amounts + type,filter_00,value);
    wtx->m_is_cache_empty = false;
    uVar2 = (ulong)*filter;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return wtx->m_amounts[type].m_value[uVar2];
  }
  __stack_chk_fail();
}

Assistant:

static CAmount GetCachableAmount(const CWallet& wallet, const CWalletTx& wtx, CWalletTx::AmountType type, const isminefilter& filter)
{
    auto& amount = wtx.m_amounts[type];
    if (!amount.m_cached[filter]) {
        amount.Set(filter, type == CWalletTx::DEBIT ? wallet.GetDebit(*wtx.tx, filter) : TxGetCredit(wallet, *wtx.tx, filter));
        wtx.m_is_cache_empty = false;
    }
    return amount.m_value[filter];
}